

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O3

void __thiscall Lodtalk::StackMemory::stackOverflow(StackMemory *this)

{
  StackFrame *this_00;
  uint8_t *puVar1;
  StackPage *pSVar2;
  uint8_t *puVar3;
  uint8_t *__src;
  undefined8 *puVar4;
  StackPage *pSVar5;
  uint8_t *puVar6;
  StackFrame previousFrame;
  StackFrame local_40;
  
  local_40.stackPointer = (this->stackFrame).framePointer;
  puVar1 = *(uint8_t **)local_40.stackPointer;
  local_40.stackPointer =
       (uint8_t *)
       ((long)local_40.stackPointer +
       ((ulong)(*(uint *)((long)local_40.stackPointer + -0x10) & 0xff) + 3) * 8);
  pSVar5 = this->currentPage;
  (pSVar5->headFrame).framePointer = puVar1;
  (pSVar5->headFrame).stackPointer = local_40.stackPointer;
  local_40.framePointer = puVar1;
  pSVar5 = allocatePage(this);
  if (pSVar5 == this->currentPage) {
    __assert_fail("nextPage != currentPage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                  ,0xe0,"void Lodtalk::StackMemory::stackOverflow()");
  }
  this_00 = &this->stackFrame;
  puVar6 = pSVar5->stackPageHighest;
  pSVar5->baseFramePointer = puVar6;
  (pSVar5->headFrame).framePointer = (uint8_t *)0x0;
  (pSVar5->headFrame).stackPointer = puVar6;
  pSVar2 = this->currentPage;
  pSVar2->nextPage = pSVar5;
  pSVar5->previousPage = pSVar2;
  puVar3 = (this->stackFrame).framePointer;
  __src = (this->stackFrame).stackPointer;
  puVar6 = puVar6 + -(long)(puVar3 + ((ulong)(*(uint *)(puVar3 + -0x10) & 0xff) * 8 - (long)__src) +
                                     0x18);
  memcpy(puVar6,__src,
         (size_t)(puVar3 + ((ulong)(*(uint *)(puVar3 + -0x10) & 0xff) * 8 - (long)__src) + 0x18));
  (this->stackFrame).framePointer = puVar6 + ((long)puVar3 - (long)__src);
  (this->stackFrame).stackPointer = puVar6;
  puVar6 = puVar6 + ((long)puVar3 - (long)__src);
  puVar6[0] = '\0';
  puVar6[1] = '\0';
  puVar6[2] = '\0';
  puVar6[3] = '\0';
  puVar6[4] = '\0';
  puVar6[5] = '\0';
  puVar6[6] = '\0';
  puVar6[7] = '\0';
  this->currentPage = pSVar5;
  puVar6 = (this->stackFrame).stackPointer;
  (pSVar5->headFrame).framePointer = this_00->framePointer;
  (pSVar5->headFrame).stackPointer = puVar6;
  this->currentPage->baseFramePointer = (this->stackFrame).framePointer;
  if (puVar1[-0xe] == '\0') {
    StackFrame::marryFrame(&local_40,this->context);
  }
  StackFrame::updateMarriedSpouseState(&local_40);
  if (this_00->framePointer[-0xe] == '\0') {
    StackFrame::marryFrame(this_00,this->context);
  }
  StackFrame::updateMarriedSpouseState(this_00);
  puVar4 = *(undefined8 **)(puVar1 + -0x18);
  *(undefined8 **)(*(long *)(this_00->framePointer + -0x18) + 8) = puVar4;
  if (puVar4 != &NilObject) {
    return;
  }
  __assert_fail("!currentContext->sender.isNil()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                ,0x101,"void Lodtalk::StackMemory::stackOverflow()");
}

Assistant:

void StackMemory::stackOverflow()
{
    // Store the previous frame
    auto previousFrame = stackFrame.getPreviousFrame();
    currentPage->headFrame = previousFrame;

    // Allocate and link the next page.
    auto nextPage = allocatePage();
    assert(nextPage != currentPage);
    nextPage->startUsing();
    currentPage->nextPage = nextPage;
    nextPage->previousPage = currentPage;

    // Get the source pointers and size
    auto srcBeginCopy = stackFrame.getBeginPointer();
    auto srcEndCopy = stackFrame.getEndPointer();
    auto copySize = srcEndCopy - srcBeginCopy;
    auto framePointerOffset = stackFrame.framePointer - srcBeginCopy;

    // Get the destination pointers
    auto dstEndCopy = nextPage->baseFramePointer;
    auto dstBeginCopy = dstEndCopy - copySize;

    // Copy the stack frame
    memcpy(dstBeginCopy, srcBeginCopy, copySize);

    // Use the new stack page
    auto newFramePointer = dstBeginCopy + framePointerOffset;
    stackFrame = StackFrame(newFramePointer, dstBeginCopy);
    stackFrame.setPrevFramePointer(nullptr);
    currentPage = nextPage;
    currentPage->headFrame = stackFrame;
    currentPage->baseFramePointer = stackFrame.framePointer;

    // Make sure they have contexts.
    previousFrame.ensureHasUpdatedMarriedSpouse(context);
    stackFrame.ensureHasUpdatedMarriedSpouse(context);

    // Link the new context with the previous context
    auto currentContext = reinterpret_cast<Context*> (stackFrame.getThisContext().pointer);
    currentContext->sender = previousFrame.getThisContext();
    assert(!currentContext->sender.isNil());
}